

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_id_getter.cpp
# Opt level: O1

void __thiscall SharedIdGetter::put(SharedIdGetter *this,uid_t id)

{
  unsigned_long *puVar1;
  unsigned_long uVar2;
  ContextManager *pCVar3;
  unique_lock<SharedMutex> lock;
  string local_48;
  unique_lock<SharedMutex> local_28;
  
  local_28._M_device = &this->mutex_;
  local_28._M_owns = false;
  std::unique_lock<SharedMutex>::lock(&local_28);
  local_28._M_owns = true;
  if (*((this->stack_head_)._M_t.
        super___uniq_ptr_impl<SharedMemoryObject<unsigned_long>,_std::default_delete<SharedMemoryObject<unsigned_long>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_SharedMemoryObject<unsigned_long>_*,_std::default_delete<SharedMemoryObject<unsigned_long>_>_>
        .super__Head_base<0UL,_SharedMemoryObject<unsigned_long>_*,_false>._M_head_impl)->ptr_ ==
      ((this->ids_stack_)._M_t.
       super___uniq_ptr_impl<SharedMemoryArray<unsigned_int>,_std::default_delete<SharedMemoryArray<unsigned_int>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_SharedMemoryArray<unsigned_int>_*,_std::default_delete<SharedMemoryArray<unsigned_int>_>_>
       .super__Head_base<0UL,_SharedMemoryArray<unsigned_int>_*,_false>._M_head_impl)->size_) {
    pCVar3 = ContextManager::get();
    format_abi_cxx11_(&local_48,"Failed to put ID (%d): stack is full",id);
    (**pCVar3->_vptr_ContextManager)(pCVar3,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  puVar1 = ((this->stack_head_)._M_t.
            super___uniq_ptr_impl<SharedMemoryObject<unsigned_long>,_std::default_delete<SharedMemoryObject<unsigned_long>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_SharedMemoryObject<unsigned_long>_*,_std::default_delete<SharedMemoryObject<unsigned_long>_>_>
            .super__Head_base<0UL,_SharedMemoryObject<unsigned_long>_*,_false>._M_head_impl)->ptr_;
  uVar2 = *puVar1;
  *(uid_t *)((long)((this->ids_stack_)._M_t.
                    super___uniq_ptr_impl<SharedMemoryArray<unsigned_int>,_std::default_delete<SharedMemoryArray<unsigned_int>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_SharedMemoryArray<unsigned_int>_*,_std::default_delete<SharedMemoryArray<unsigned_int>_>_>
                    .super__Head_base<0UL,_SharedMemoryArray<unsigned_int>_*,_false>._M_head_impl)->
                   ptr_ + uVar2 * 4) = id;
  *puVar1 = uVar2 + 1;
  std::unique_lock<SharedMutex>::~unique_lock(&local_28);
  return;
}

Assistant:

void SharedIdGetter::put(uid_t id) {
    std::unique_lock lock(mutex_);
    if (*stack_head_->get() == ids_stack_->size()) {
        die(format("Failed to put ID (%d): stack is full", id));
    }
    (*ids_stack_)[*stack_head_->get()] = id;
    (*stack_head_->get())++;
}